

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quantile_sort_tree.hpp
# Opt level: O3

RESULT_TYPE __thiscall
duckdb::QuantileComposed<duckdb::MadAccessor<short,_short,_short>,_duckdb::QuantileIndirect<short>_>
::operator()(QuantileComposed<duckdb::MadAccessor<short,_short,_short>,_duckdb::QuantileIndirect<short>_>
             *this,idx_t *input)

{
  MadAccessor<short,_short,_short> *pMVar1;
  CURSOR *pCVar2;
  ColumnDataScanState *pCVar3;
  short sVar4;
  reference pvVar5;
  ColumnDataScanState *pCVar6;
  OutOfRangeException *this_00;
  short sVar7;
  string local_48;
  
  pMVar1 = this->outer;
  pCVar2 = this->inner->data;
  pCVar3 = (ColumnDataScanState *)*input;
  pCVar6 = (ColumnDataScanState *)(pCVar2->scan).current_row_index;
  if ((ColumnDataScanState *)(pCVar2->scan).next_row_index <= pCVar3 || pCVar3 < pCVar6) {
    duckdb::ColumnDataCollection::Seek((ulong)pCVar2->inputs,pCVar3,(DataChunk *)&pCVar2->scan);
    pvVar5 = vector<duckdb::Vector,_true>::operator[]
                       ((vector<duckdb::Vector,_true> *)&pCVar2->page,0);
    pCVar2->data = *(short **)(pvVar5 + 0x20);
    pvVar5 = vector<duckdb::Vector,_true>::operator[]
                       ((vector<duckdb::Vector,_true> *)&pCVar2->page,0);
    FlatVector::VerifyFlatVector(pvVar5);
    pCVar2->validity = (ValidityMask *)(pvVar5 + 0x28);
    pCVar6 = (ColumnDataScanState *)(pCVar2->scan).current_row_index;
  }
  sVar7 = pCVar2->data[(uint)((int)pCVar3 - (int)pCVar6)] - *pMVar1->median;
  if (sVar7 != -0x8000) {
    sVar4 = -sVar7;
    if (0 < sVar7) {
      sVar4 = sVar7;
    }
    return sVar4;
  }
  this_00 = (OutOfRangeException *)__cxa_allocate_exception(0x10);
  local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_48,"Overflow on abs(%d)","");
  OutOfRangeException::OutOfRangeException<short>(this_00,&local_48,-0x8000);
  __cxa_throw(this_00,&OutOfRangeException::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

inline RESULT_TYPE operator()(const idx_t &input) const {
		return outer(inner(input));
	}